

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O3

int WebPPictureCrop(WebPPicture *pic,int left,int top,int width,int height)

{
  int iVar1;
  int width_00;
  uint32_t *src;
  int height_00;
  WebPPicture tmp;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  WebPPicture local_130;
  
  if (pic == (WebPPicture *)0x0) {
    return 0;
  }
  local_140 = top;
  local_13c = left;
  iVar1 = AdjustAndCheckRectangle(pic,&local_13c,&local_140,width,height);
  if (iVar1 == 0) {
    return 0;
  }
  memcpy(&local_130,pic,0x100);
  WebPPictureResetBuffers(&local_130);
  local_130.width = width;
  local_130.height = height;
  iVar1 = WebPPictureAlloc(&local_130);
  if (iVar1 == 0) {
    iVar1 = WebPEncodingSetError(pic,local_130.error_code);
    return iVar1;
  }
  if (pic->use_argb == 0) {
    local_134 = local_140;
    local_138 = local_13c;
    iVar1 = local_13c / 2 + (local_140 / 2) * pic->uv_stride;
    WebPCopyPlane(pic->y + (pic->y_stride * local_140 + local_13c),pic->y_stride,local_130.y,
                  local_130.y_stride,width,height);
    width_00 = width + 1 >> 1;
    height_00 = height + 1 >> 1;
    WebPCopyPlane(pic->u + iVar1,pic->uv_stride,local_130.u,local_130.uv_stride,width_00,height_00);
    WebPCopyPlane(pic->v + iVar1,pic->uv_stride,local_130.v,local_130.uv_stride,width_00,height_00);
    if ((uint32_t *)local_130.a == (uint32_t *)0x0) goto LAB_00178a6d;
    iVar1 = pic->a_stride;
    src = (uint32_t *)(pic->a + (local_134 * iVar1 + local_138));
    local_130.argb = (uint32_t *)local_130.a;
  }
  else {
    src = pic->argb + (long)local_140 * (long)pic->argb_stride + (long)local_13c;
    iVar1 = pic->argb_stride * 4;
    local_130.a_stride = local_130.argb_stride << 2;
    width = width << 2;
  }
  WebPCopyPlane((uint8_t *)src,iVar1,(uint8_t *)local_130.argb,local_130.a_stride,width,height);
LAB_00178a6d:
  WebPPictureFree(pic);
  memcpy(pic,&local_130,0x100);
  return 1;
}

Assistant:

int WebPPictureCrop(WebPPicture* pic,
                    int left, int top, int width, int height) {
  WebPPicture tmp;

  if (pic == NULL) return 0;
  if (!AdjustAndCheckRectangle(pic, &left, &top, width, height)) return 0;

  PictureGrabSpecs(pic, &tmp);
  tmp.width = width;
  tmp.height = height;
  if (!WebPPictureAlloc(&tmp)) {
    return WebPEncodingSetError(pic, tmp.error_code);
  }

  if (!pic->use_argb) {
    const int y_offset = top * pic->y_stride + left;
    const int uv_offset = (top / 2) * pic->uv_stride + left / 2;
    WebPCopyPlane(pic->y + y_offset, pic->y_stride,
                  tmp.y, tmp.y_stride, width, height);
    WebPCopyPlane(pic->u + uv_offset, pic->uv_stride,
                  tmp.u, tmp.uv_stride, HALVE(width), HALVE(height));
    WebPCopyPlane(pic->v + uv_offset, pic->uv_stride,
                  tmp.v, tmp.uv_stride, HALVE(width), HALVE(height));

    if (tmp.a != NULL) {
      const int a_offset = top * pic->a_stride + left;
      WebPCopyPlane(pic->a + a_offset, pic->a_stride,
                    tmp.a, tmp.a_stride, width, height);
    }
  } else {
    const uint8_t* const src =
        (const uint8_t*)(pic->argb + top * pic->argb_stride + left);
    WebPCopyPlane(src, pic->argb_stride * 4, (uint8_t*)tmp.argb,
                  tmp.argb_stride * 4, width * 4, height);
  }
  WebPPictureFree(pic);
  *pic = tmp;
  return 1;
}